

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O3

bool __thiscall
ObjectModelBuilder::buildMaybeReplicator(ObjectModelBuilder *this,value *value,Class *clazz)

{
  bool bVar1;
  ostream *poVar2;
  
  if (value->type_ == 5) {
    bVar1 = buildReplicator(this,(object *)(value->u_).string_,clazz);
    return bVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"error: \'replicator\' in class=",0x1d);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(clazz->name)._M_dataplus._M_p,
                      (clazz->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is no a JSON object",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return false;
}

Assistant:

bool ObjectModelBuilder::buildMaybeReplicator(const picojson::value &value, Class *clazz)
{
    if (!value.is<picojson::object>()) {
        std::cerr << "error: 'replicator' in class=" << clazz->name << " is no a JSON object" << std::endl;
        return false;
    }

    return buildReplicator(value.get<picojson::object>(), clazz);
}